

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O0

void __thiscall CTcGenTarg::write_metadep_to_object_file(CTcGenTarg *this,CVmFile *fp)

{
  CVmFile *this_00;
  CVmFile *in_RSI;
  long in_RDI;
  size_t len;
  tc_meta_entry *cur;
  uint v;
  CVmFile *in_stack_ffffffffffffffe0;
  long *buf;
  
  v = (uint)((ulong)in_RDI >> 0x20);
  CVmFile::write_uint2(in_stack_ffffffffffffffe0,v);
  for (buf = *(long **)(in_RDI + 0x20); buf != (long *)0x0; buf = (long *)*buf) {
    this_00 = (CVmFile *)strlen((char *)(buf + 2));
    CVmFile::write_uint2(this_00,v);
    CVmFile::write_bytes(in_RSI,(char *)buf,(size_t)this_00);
  }
  return;
}

Assistant:

void CTcGenTarg::write_metadep_to_object_file(CVmFile *fp)
{
    tc_meta_entry *cur;

    /* write the count */
    fp->write_uint2(meta_cnt_);

    /* write the entries */
    for (cur = meta_head_ ; cur != 0 ; cur = cur->nxt)
    {
        size_t len;

        len = strlen(cur->nm);
        fp->write_uint2(len);
        fp->write_bytes(cur->nm, len);
    }
}